

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

void __thiscall
cfd::core::KeyData::KeyData
          (KeyData *this,string *path_info,int32_t child_num,bool has_schnorr_pubkey)

{
  unsigned_long uVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  reference pvVar8;
  size_type sVar9;
  undefined8 uVar10;
  size_type sVar11;
  Privkey *in_stack_fffffffffffff7a8;
  undefined6 in_stack_fffffffffffff7b0;
  undefined1 in_stack_fffffffffffff7b6;
  undefined1 in_stack_fffffffffffff7b7;
  string *in_stack_fffffffffffff7c0;
  undefined8 in_stack_fffffffffffff7c8;
  CfdError error_code;
  CfdException *in_stack_fffffffffffff7d0;
  Pubkey local_770;
  Privkey local_758;
  Pubkey local_738;
  undefined1 local_720 [8];
  SchnorrPubkey schnorr_pubkey;
  Pubkey local_6f0;
  undefined1 local_6d8 [8];
  ByteData bytes;
  Privkey local_6a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_688;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_680;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_678;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_670;
  allocator local_661;
  string local_660;
  undefined1 local_640 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> path_list;
  ExtPubkey local_610;
  ExtPubkey local_580;
  undefined1 local_4ea;
  allocator local_4e9;
  string local_4e8 [32];
  CfdSourceLocation local_4c8;
  Pubkey local_4b0;
  Privkey local_498;
  ExtPubkey local_478;
  ExtPrivkey local_3e8;
  ExtPrivkey local_358;
  string local_2c8 [8];
  string base_extkey_;
  allocator local_281;
  string local_280 [32];
  CfdSourceLocation local_260;
  undefined1 local_242;
  allocator local_241;
  string local_240 [32];
  CfdSourceLocation local_220;
  ulong local_208;
  unsigned_long value;
  size_t index;
  string local_1f0 [32];
  undefined1 local_1d0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  undefined1 local_1b0 [6];
  bool exist_hardened;
  bool has_end_any_hardened;
  string key;
  string path_1;
  string local_150 [8];
  string hdkey_top;
  string local_128;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_108;
  undefined1 local_f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> child_path;
  undefined1 local_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fingerprint;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> path;
  size_type pos;
  string key_info;
  bool has_schnorr_pubkey_local;
  int32_t child_num_local;
  string *path_info_local;
  KeyData *this_local;
  
  Pubkey::Pubkey(&this->pubkey_);
  Privkey::Privkey(&this->privkey_);
  ExtPrivkey::ExtPrivkey(&this->extprivkey_);
  ExtPubkey::ExtPubkey(&this->extpubkey_);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x4674ff);
  ByteData::ByteData(&this->fingerprint_);
  ::std::__cxx11::string::string((string *)&pos,(string *)path_info);
  pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)path_info);
  if ((*pcVar5 == '[') &&
     (lVar6 = ::std::__cxx11::string::find((char *)path_info,0x9eedd5), lVar6 != -1)) {
    ::std::__cxx11::string::substr((ulong)((long)&path.field_2 + 8),(ulong)path_info);
    ::std::__cxx11::string::operator=((string *)&pos,(string *)(path.field_2._M_local_buf + 8));
    ::std::__cxx11::string::~string((string *)(path.field_2._M_local_buf + 8));
    ::std::__cxx11::string::substr((ulong)((long)&fingerprint.field_2 + 8),(ulong)path_info);
    lVar6 = ::std::__cxx11::string::find(fingerprint.field_2._M_local_buf + 8,0x8a930f);
    if (lVar6 != -1) {
      if (lVar6 != 0) {
        ::std::__cxx11::string::substr((ulong)local_b8,(ulong)((long)&fingerprint.field_2 + 8));
        ByteData::ByteData((ByteData *)((long)&child_path.field_2 + 8),(string *)local_b8);
        ByteData::operator=(&this->fingerprint_,(ByteData *)((long)&child_path.field_2 + 8));
        ByteData::~ByteData((ByteData *)0x46764c);
        ::std::__cxx11::string::~string((string *)local_b8);
      }
      ::std::__cxx11::string::substr((ulong)local_f0,(ulong)((long)&fingerprint.field_2 + 8));
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_128,"KeyData",(allocator *)(hdkey_top.field_2._M_local_buf + 0xf))
      ;
      ToArrayFromString(&local_108,(string *)local_f0,&local_128,'\0');
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&this->path_,&local_108)
      ;
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff7c0);
      ::std::__cxx11::string::~string((string *)&local_128);
      ::std::allocator<char>::~allocator((allocator<char> *)(hdkey_top.field_2._M_local_buf + 0xf));
      ::std::__cxx11::string::~string((string *)local_f0);
    }
    ::std::__cxx11::string::~string((string *)(fingerprint.field_2._M_local_buf + 8));
  }
  ::std::__cxx11::string::string(local_150);
  uVar7 = ::std::__cxx11::string::size();
  if (4 < uVar7) {
    ::std::__cxx11::string::substr((ulong)((long)&path_1.field_2 + 8),(ulong)&pos);
    ::std::__cxx11::string::operator=(local_150,(string *)(path_1.field_2._M_local_buf + 8));
    ::std::__cxx11::string::~string((string *)(path_1.field_2._M_local_buf + 8));
  }
  bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffff7b7,
                                     CONCAT16(in_stack_fffffffffffff7b6,in_stack_fffffffffffff7b0)),
                            (char *)in_stack_fffffffffffff7a8);
  if ((bVar2) ||
     (bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffff7b7,
                                          CONCAT16(in_stack_fffffffffffff7b6,
                                                   in_stack_fffffffffffff7b0)),
                                (char *)in_stack_fffffffffffff7a8), bVar2)) {
    ::std::__cxx11::string::string((string *)(key.field_2._M_local_buf + 8));
    ::std::__cxx11::string::string((string *)local_1b0);
    list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_1f0,"/",(allocator *)((long)&index + 7));
    StringUtil::Split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1d0,(string *)&pos,(string *)local_1f0);
    ::std::__cxx11::string::~string(local_1f0);
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&index + 7));
    pvVar8 = ::std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_1d0,0);
    ::std::__cxx11::string::operator=((string *)local_1b0,(string *)pvVar8);
    sVar9 = ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1d0);
    error_code = (CfdError)((ulong)in_stack_fffffffffffff7c8 >> 0x20);
    if (1 < sVar9) {
      value = 1;
      while( true ) {
        uVar1 = value;
        sVar9 = ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_1d0);
        error_code = (CfdError)((ulong)in_stack_fffffffffffff7c8 >> 0x20);
        if (sVar9 <= uVar1) break;
        if (value != 1) {
          ::std::__cxx11::string::operator+=((string *)(key.field_2._M_local_buf + 8),"/");
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1d0,value);
        bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffff7b7,
                                              CONCAT16(in_stack_fffffffffffff7b6,
                                                       in_stack_fffffffffffff7b0)),
                                  (char *)in_stack_fffffffffffff7a8);
        error_code = (CfdError)((ulong)in_stack_fffffffffffff7c8 >> 0x20);
        if (bVar2) break;
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1d0,value);
        bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffff7b7,
                                              CONCAT16(in_stack_fffffffffffff7b6,
                                                       in_stack_fffffffffffff7b0)),
                                  (char *)in_stack_fffffffffffff7a8);
        error_code = (CfdError)((ulong)in_stack_fffffffffffff7c8 >> 0x20);
        if (bVar2) {
LAB_00467b1d:
          list.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
          list.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
          break;
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1d0,value);
        bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffff7b7,
                                              CONCAT16(in_stack_fffffffffffff7b6,
                                                       in_stack_fffffffffffff7b0)),
                                  (char *)in_stack_fffffffffffff7a8);
        error_code = (CfdError)((ulong)in_stack_fffffffffffff7c8 >> 0x20);
        if (bVar2) goto LAB_00467b1d;
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1d0,value);
        bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffff7b7,
                                              CONCAT16(in_stack_fffffffffffff7b6,
                                                       in_stack_fffffffffffff7b0)),
                                  (char *)in_stack_fffffffffffff7a8);
        error_code = (CfdError)((ulong)in_stack_fffffffffffff7c8 >> 0x20);
        if (bVar2) goto LAB_00467b1d;
        pvVar8 = ::std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_1d0,value);
        ::std::__cxx11::string::operator+=
                  ((string *)(key.field_2._M_local_buf + 8),(string *)pvVar8);
        pvVar8 = ::std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_1d0,value);
        lVar6 = ::std::__cxx11::string::find((char *)pvVar8,0x8ab183);
        if (lVar6 == -1) {
          pvVar8 = ::std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_1d0,value);
          lVar6 = ::std::__cxx11::string::find((char *)pvVar8,0x8ab186);
          if (lVar6 != -1) goto LAB_00467bd8;
          pvVar8 = ::std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_1d0,value);
          lVar6 = ::std::__cxx11::string::find((char *)pvVar8,0x8acce8);
          if (lVar6 != -1) goto LAB_00467bd8;
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_1d0,value);
          pcVar5 = (char *)::std::__cxx11::string::c_str();
          local_208 = strtoul(pcVar5,(char **)0x0,0);
          if (0x7fffffff < local_208) {
            list.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
          }
        }
        else {
LAB_00467bd8:
          list.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
        }
        value = value + 1;
      }
      uVar7 = value + 1;
      sVar9 = ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1d0);
      if (uVar7 < sVar9) {
        local_220.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_hdwallet.cpp"
                     ,0x2f);
        local_220.filename = local_220.filename + 1;
        local_220.line = 0x4a8;
        local_220.funcname = "KeyData";
        logger::warn<>(&local_220,"Failed to extkey path. A \'*\' can only be specified at the end."
                      );
        local_242 = 1;
        uVar10 = __cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_240,"Failed to extkey path. A \'*\' can only be specified at the end.",
                   &local_241);
        CfdException::CfdException(in_stack_fffffffffffff7d0,error_code,in_stack_fffffffffffff7c0);
        local_242 = 0;
        __cxa_throw(uVar10,&CfdException::typeinfo,CfdException::~CfdException);
      }
      pvVar8 = ::std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1d0);
      lVar6 = ::std::__cxx11::string::find((char *)pvVar8,0x8b1e53);
      if (lVar6 != -1) {
        if (child_num < 0) {
          local_260.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_hdwallet.cpp"
                       ,0x2f);
          local_260.filename = local_260.filename + 1;
          local_260.line = 0x4b3;
          local_260.funcname = "KeyData";
          logger::warn<>(&local_260,"Failed to extkey path. A \'*\' can not support.");
          uVar10 = __cxa_allocate_exception(0x30);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_280,"Failed to extkey path. A \'*\' can not support.",&local_281);
          CfdException::CfdException(in_stack_fffffffffffff7d0,error_code,in_stack_fffffffffffff7c0)
          ;
          __cxa_throw(uVar10,&CfdException::typeinfo,CfdException::~CfdException);
        }
        ::std::__cxx11::to_string((string *)((long)&base_extkey_.field_2 + 8),child_num);
        ::std::__cxx11::string::operator+=
                  ((string *)(key.field_2._M_local_buf + 8),
                   (string *)(base_extkey_.field_2._M_local_buf + 8));
        ::std::__cxx11::string::~string((string *)(base_extkey_.field_2._M_local_buf + 8));
        if ((list.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
          ::std::__cxx11::string::operator+=((string *)(key.field_2._M_local_buf + 8),"h");
        }
      }
    }
    ::std::__cxx11::string::string(local_2c8);
    bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffff7b7,
                                       CONCAT16(in_stack_fffffffffffff7b6,in_stack_fffffffffffff7b0)
                                      ),(char *)in_stack_fffffffffffff7a8);
    if (bVar2) {
      ExtPrivkey::ExtPrivkey(&local_358,(string *)local_1b0);
      ExtPrivkey::operator=(&this->extprivkey_,&local_358);
      ExtPrivkey::~ExtPrivkey((ExtPrivkey *)0x467fc2);
      uVar7 = ::std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        ExtPrivkey::DerivePrivkey(&local_3e8,&this->extprivkey_,(string *)((long)&key.field_2 + 8));
        ExtPrivkey::operator=(&this->extprivkey_,&local_3e8);
        ExtPrivkey::~ExtPrivkey((ExtPrivkey *)0x46801b);
      }
      ExtPrivkey::GetExtPubkey(&local_478,&this->extprivkey_);
      ExtPubkey::operator=(&this->extpubkey_,&local_478);
      ExtPubkey::~ExtPubkey((ExtPubkey *)0x4680a9);
      Extkey::GetPrivkey(&local_498,&(this->extprivkey_).super_Extkey);
      Privkey::operator=((Privkey *)
                         CONCAT17(in_stack_fffffffffffff7b7,
                                  CONCAT16(in_stack_fffffffffffff7b6,in_stack_fffffffffffff7b0)),
                         in_stack_fffffffffffff7a8);
      Privkey::~Privkey((Privkey *)0x4680e7);
      Privkey::GetPubkey(&local_4b0,&this->privkey_);
      Pubkey::operator=(&this->pubkey_,&local_4b0);
      Pubkey::~Pubkey((Pubkey *)0x468121);
    }
    else {
      if ((list.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
        local_4c8.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_hdwallet.cpp"
                     ,0x2f);
        local_4c8.filename = local_4c8.filename + 1;
        local_4c8.line = 0x4c8;
        local_4c8.funcname = "KeyData";
        logger::warn<>(&local_4c8,"Failed to extPubkey. hardened is extPrivkey only.");
        local_4ea = 1;
        uVar10 = __cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_4e8,"Failed to extPubkey. hardened is extPrivkey only.",&local_4e9);
        CfdException::CfdException(in_stack_fffffffffffff7d0,error_code,in_stack_fffffffffffff7c0);
        local_4ea = 0;
        __cxa_throw(uVar10,&CfdException::typeinfo,CfdException::~CfdException);
      }
      ExtPubkey::ExtPubkey(&local_580,(string *)local_1b0);
      ExtPubkey::operator=(&this->extpubkey_,&local_580);
      ExtPubkey::~ExtPubkey((ExtPubkey *)0x4682e4);
      uVar7 = ::std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        ExtPubkey::DerivePubkey(&local_610,&this->extpubkey_,(string *)((long)&key.field_2 + 8));
        ExtPubkey::operator=(&this->extpubkey_,&local_610);
        ExtPubkey::~ExtPubkey((ExtPubkey *)0x468343);
      }
      Extkey::GetPubkey((Pubkey *)
                        &path_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,
                        &(this->extpubkey_).super_Extkey);
      Pubkey::operator=(&this->pubkey_,
                        (Pubkey *)
                        &path_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
      Pubkey::~Pubkey((Pubkey *)0x4683bc);
    }
    uVar7 = ::std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_660,"KeyData",&local_661);
      ToArrayFromString((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_640,
                        (string *)((long)&key.field_2 + 8),&local_660,'\0');
      ::std::__cxx11::string::~string((string *)&local_660);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_661);
      sVar9 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->path_);
      sVar11 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_640);
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                (&this->path_,sVar9 + sVar11);
      in_stack_fffffffffffff7c0 = (string *)local_640;
      local_670._M_current =
           (uint *)::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              in_stack_fffffffffffff7c0);
      local_678._M_current =
           (uint *)::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              in_stack_fffffffffffff7c0);
      local_680 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                  ::std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                            (&this->path_);
      local_688 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                  ::std::
                  copy<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                            (local_670,local_678,
                             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              )local_680);
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff7c0);
    }
    ::std::__cxx11::string::~string(local_2c8);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff7c0);
    ::std::__cxx11::string::~string((string *)local_1b0);
    ::std::__cxx11::string::~string((string *)(key.field_2._M_local_buf + 8));
  }
  else {
    uVar3 = Privkey::HasWif((string *)&pos,(NetType *)0x0,(bool *)0x0);
    if ((bool)uVar3) {
      Privkey::FromWif(&local_6a8,(string *)&pos,kCustomChain,true);
      Privkey::operator=((Privkey *)
                         CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffff7b6,in_stack_fffffffffffff7b0
                                                )),in_stack_fffffffffffff7a8);
      Privkey::~Privkey((Privkey *)0x468651);
      Privkey::GetPubkey((Pubkey *)
                         &bytes.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,&this->privkey_);
      Pubkey::operator=(&this->pubkey_,
                        (Pubkey *)
                        &bytes.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
      Pubkey::~Pubkey((Pubkey *)0x46868b);
    }
    else {
      ByteData::ByteData((ByteData *)local_6d8,(string *)&pos);
      uVar4 = Pubkey::IsValid((ByteData *)local_6d8);
      if ((bool)uVar4) {
        ByteData::ByteData((ByteData *)CONCAT17(uVar3,CONCAT16(uVar4,in_stack_fffffffffffff7b0)),
                           &in_stack_fffffffffffff7a8->data_);
        Pubkey::Pubkey(&local_6f0,
                       (ByteData *)
                       &schnorr_pubkey.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
        Pubkey::operator=(&this->pubkey_,&local_6f0);
        Pubkey::~Pubkey((Pubkey *)0x46874a);
        ByteData::~ByteData((ByteData *)0x468756);
      }
      else if (has_schnorr_pubkey) {
        SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)local_720,(ByteData *)local_6d8);
        SchnorrPubkey::CreatePubkey(&local_738,(SchnorrPubkey *)local_720,false);
        Pubkey::operator=(&this->pubkey_,&local_738);
        Pubkey::~Pubkey((Pubkey *)0x4687fa);
        SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)0x468806);
      }
      else {
        Privkey::Privkey(&local_758,(ByteData *)local_6d8,kMainnet,true);
        Privkey::operator=((Privkey *)CONCAT17(uVar3,CONCAT16(uVar4,in_stack_fffffffffffff7b0)),
                           in_stack_fffffffffffff7a8);
        Privkey::~Privkey((Privkey *)0x468883);
        Privkey::GetPubkey(&local_770,&this->privkey_);
        Pubkey::operator=(&this->pubkey_,&local_770);
        Pubkey::~Pubkey((Pubkey *)0x4688bd);
      }
      ByteData::~ByteData((ByteData *)0x468901);
    }
  }
  ::std::__cxx11::string::~string(local_150);
  ::std::__cxx11::string::~string((string *)&pos);
  return;
}

Assistant:

KeyData::KeyData(
    const std::string& path_info, int32_t child_num, bool has_schnorr_pubkey) {
  std::string key_info = path_info;
  if (path_info[0] == '[') {
    // key origin information check. cut to ']'
    auto pos = path_info.find("]");
    if (pos != std::string::npos) {
      key_info = path_info.substr(pos + 1);
      auto path = path_info.substr(1, pos - 1);
      pos = path.find("/");
      if (pos != std::string::npos) {
        if (pos != 0) {
          auto fingerprint = path.substr(0, pos);
          fingerprint_ = ByteData(fingerprint);
        }
        auto child_path = path.substr(pos + 1);
        path_ = ToArrayFromString(child_path, "KeyData", 0);
      }
    }
  }
  // derive key check (xpub,etc)D
  std::string hdkey_top;
  if (key_info.size() > 4) hdkey_top = key_info.substr(1, 3);
  if ((hdkey_top == "pub") || (hdkey_top == "prv")) {
    std::string path;
    std::string key;
    bool has_end_any_hardened = false;
    bool exist_hardened = false;
    std::vector<std::string> list = StringUtil::Split(key_info, "/");
    key = list[0];
    if (list.size() > 1) {
      size_t index;
      for (index = 1; index < list.size(); ++index) {
        if (index != 1) path += "/";
        if (list[index] == "*") break;
        if ((list[index] == "*'") || (list[index] == "*h") ||
            (list[index] == "*H")) {
          has_end_any_hardened = true;
          exist_hardened = true;
          break;
        }
        path += list[index];
        if ((list[index].find("'") != std::string::npos) ||
            (list[index].find("h") != std::string::npos) ||
            (list[index].find("H") != std::string::npos)) {
          exist_hardened = true;
        } else {
          auto value = strtoul(list[index].c_str(), nullptr, 0);
          if (value >= 0x80000000) exist_hardened = true;
        }
      }
      if ((index + 1) < list.size()) {
        warn(
            CFD_LOG_SOURCE,
            "Failed to extkey path. "
            "A '*' can only be specified at the end.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to extkey path. "
            "A '*' can only be specified at the end.");
      }
      if (list.back().find("*") != std::string::npos) {
        if (child_num < 0) {
          warn(
              CFD_LOG_SOURCE,
              "Failed to extkey path. "
              "A '*' can not support.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to extkey path. "
              "A '*' can not support.");
        }
        path += std::to_string(child_num);
        if (has_end_any_hardened) path += "h";
      }
    }
    std::string base_extkey_;
    if (hdkey_top == "prv") {
      extprivkey_ = ExtPrivkey(key);
      if (!path.empty()) extprivkey_ = extprivkey_.DerivePrivkey(path);
      extpubkey_ = extprivkey_.GetExtPubkey();
      privkey_ = extprivkey_.GetPrivkey();
      pubkey_ = privkey_.GetPubkey();
    } else if (exist_hardened) {
      warn(
          CFD_LOG_SOURCE, "Failed to extPubkey. hardened is extPrivkey only.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to extPubkey. hardened is extPrivkey only.");
    } else {
      extpubkey_ = ExtPubkey(key);
      if (!path.empty()) extpubkey_ = extpubkey_.DerivePubkey(path);
      pubkey_ = extpubkey_.GetPubkey();
    }
    if (!path.empty()) {
      auto path_list = ToArrayFromString(path, "KeyData", 0);
      path_.reserve(path_.size() + path_list.size());
      std::copy(path_list.begin(), path_list.end(), std::back_inserter(path_));
    }
  } else if (Privkey::HasWif(key_info)) {
    privkey_ = Privkey::FromWif(key_info);
    pubkey_ = privkey_.GetPubkey();
  } else {
    ByteData bytes(key_info);
    if (Pubkey::IsValid(bytes)) {
      pubkey_ = Pubkey(bytes);
    } else if (has_schnorr_pubkey) {
      SchnorrPubkey schnorr_pubkey(bytes);
      pubkey_ = schnorr_pubkey.CreatePubkey();
    } else {
      privkey_ = Privkey(bytes);
      pubkey_ = privkey_.GetPubkey();
    }
  }
}